

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

decimal_fp<float> fmt::v9::detail::dragonbox::to_decimal<float>(float x)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  
  uVar12 = (uint)x & 0x7fffff;
  uVar5 = (uint)x >> 0x17 & 0xff;
  if (uVar5 == 0) {
    uVar5 = 0xffffff6b;
    if (uVar12 == 0) {
      uVar6 = 0;
      uVar10 = 0;
      goto LAB_00145fb7;
    }
  }
  else {
    uVar5 = uVar5 - 0x96;
    if (uVar12 == 0) {
      uVar12 = (int)(uVar5 * 0x9a209 + -0x3fe1f) >> 0x15;
      uVar10 = (ulong)uVar12;
      cVar8 = (char)((int)(uVar12 * -0x1a934f) >> 0x13) + (char)uVar5;
      uVar11 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                         (ulong)(0x1f - uVar12) * 8);
      bVar4 = 0x28 - cVar8;
      uVar9 = (uint)((uVar5 & 0xfffffffe) != 2) + (int)(uVar11 - (uVar11 >> 0x19) >> (bVar4 & 0x3f))
      ;
      uVar2 = (uVar11 >> 0x18) + uVar11 >> (bVar4 & 0x3f) & 0xffffffff;
      if ((uint)((int)(uVar2 / 10) * 10) < uVar9) {
        uVar6 = (int)(uVar11 >> (0x27U - cVar8 & 0x3f)) + 1U >> 1;
        if (uVar5 == 0xffffffdd) {
          uVar6 = uVar6 & 0xfffffffe;
        }
        else {
          uVar6 = uVar6 + (uVar6 < uVar9);
        }
      }
      else {
        uVar10 = uVar2 / 10;
        uVar5 = 0;
        do {
          uVar9 = uVar5;
          uVar6 = (int)uVar10 * 0x40000000 | (uint)((int)uVar10 * -0x3d70a3d7) >> 2;
          uVar11 = (ulong)uVar6;
          if (0x28f5c28 < uVar6) {
            uVar11 = uVar10;
          }
          uVar10 = uVar11;
          uVar5 = uVar9 + 2;
        } while (0x28f5c28 >= uVar6);
        uVar5 = (uint)uVar11 * -0x33333333;
        uVar5 = uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f;
        uVar6 = uVar5;
        if (uVar5 >= 0x1999999a) {
          uVar6 = (uint)uVar11;
        }
        uVar10 = (ulong)(uVar12 + (uVar9 | uVar5 < 0x1999999a) + 1);
      }
      goto LAB_00145fb7;
    }
    uVar12 = uVar12 | 0x800000;
  }
  uVar9 = (int)(uVar5 * 0x4d105) >> 0x14;
  uVar10 = (ulong)uVar9;
  uVar11 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                     (ulong)(0x20 - uVar9) * 8);
  bVar4 = (char)((int)((1 - uVar9) * 0x1a934f) >> 0x13) + (char)uVar5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar11;
  auVar1 = (ZEXT416(uVar12 * 2 + 1 << (bVar4 & 0x1f)) << 0x20) * auVar1;
  uVar2 = auVar1._8_8_ >> 0x20;
  iVar13 = (int)(uVar2 / 100);
  iVar7 = (int)(uVar2 / 100);
  uVar6 = iVar7 * -100 + auVar1._12_4_;
  uVar5 = (uint)(uVar11 >> (~bVar4 & 0x3f));
  if (uVar6 < uVar5) {
    if ((uVar6 != 0) || ((auVar1._8_4_ != 0 || ((uVar12 & 1) == 0)))) {
LAB_00145e24:
      uVar10 = uVar2 / 100;
      uVar5 = 0;
      do {
        uVar12 = uVar5;
        uVar6 = (int)uVar10 * 0x40000000 | (uint)((int)uVar10 * -0x3d70a3d7) >> 2;
        uVar11 = (ulong)uVar6;
        if (0x28f5c28 < uVar6) {
          uVar11 = uVar10;
        }
        uVar10 = uVar11;
        uVar5 = uVar12 + 2;
      } while (0x28f5c28 >= uVar6);
      uVar5 = (uint)uVar11 * -0x33333333;
      uVar5 = uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f;
      uVar6 = uVar5;
      if (uVar5 >= 0x1999999a) {
        uVar6 = (uint)uVar11;
      }
      uVar10 = (ulong)(uVar9 + (uVar12 | uVar5 < 0x1999999a) + 1);
      goto LAB_00145fb7;
    }
    iVar13 = iVar7 + -1;
    uVar6 = 100;
  }
  else if ((uVar6 <= uVar5) &&
          (uVar3 = (uVar12 * 2 - 1) * uVar11,
          ((uint)((int)(uVar3 >> (-(bVar4 + 0x20) & 0x3f)) == 0) & ~uVar12) != 0 ||
          (uVar3 >> ((ulong)(byte)(0x40 - bVar4) & 0x3f) & 1) != 0)) goto LAB_00145e24;
  iVar7 = uVar6 - (uVar5 >> 1);
  uVar5 = iVar7 * 0x199a + 0x8002;
  uVar6 = (uVar5 >> 0x10) + iVar13 * 10;
  if ((uVar5 & 0xffff) < 0x199a) {
    uVar11 = uVar11 * (uVar12 * 2);
    if (((uVar11 >> ((ulong)(byte)(0x40 - bVar4) & 0x3f) & 1) != 0) == (bool)((byte)iVar7 & 1)) {
      uVar6 = uVar6 - ((byte)(uVar5 >> 0x10) & 1 & (int)(uVar11 >> (-(bVar4 + 0x20) & 0x3f)) == 0);
    }
    else {
      uVar6 = uVar6 - 1;
    }
  }
LAB_00145fb7:
  return (decimal_fp<float>)((ulong)uVar6 | uVar10 << 0x20);
}

Assistant:

static uint64_t get_cached_power(int k) noexcept {
    FMT_ASSERT(k >= float_info<float>::min_k && k <= float_info<float>::max_k,
               "k is out of range");
    static constexpr const uint64_t pow10_significands[] = {
        0x81ceb32c4b43fcf5, 0xa2425ff75e14fc32, 0xcad2f7f5359a3b3f,
        0xfd87b5f28300ca0e, 0x9e74d1b791e07e49, 0xc612062576589ddb,
        0xf79687aed3eec552, 0x9abe14cd44753b53, 0xc16d9a0095928a28,
        0xf1c90080baf72cb2, 0x971da05074da7bef, 0xbce5086492111aeb,
        0xec1e4a7db69561a6, 0x9392ee8e921d5d08, 0xb877aa3236a4b44a,
        0xe69594bec44de15c, 0x901d7cf73ab0acda, 0xb424dc35095cd810,
        0xe12e13424bb40e14, 0x8cbccc096f5088cc, 0xafebff0bcb24aaff,
        0xdbe6fecebdedd5bf, 0x89705f4136b4a598, 0xabcc77118461cefd,
        0xd6bf94d5e57a42bd, 0x8637bd05af6c69b6, 0xa7c5ac471b478424,
        0xd1b71758e219652c, 0x83126e978d4fdf3c, 0xa3d70a3d70a3d70b,
        0xcccccccccccccccd, 0x8000000000000000, 0xa000000000000000,
        0xc800000000000000, 0xfa00000000000000, 0x9c40000000000000,
        0xc350000000000000, 0xf424000000000000, 0x9896800000000000,
        0xbebc200000000000, 0xee6b280000000000, 0x9502f90000000000,
        0xba43b74000000000, 0xe8d4a51000000000, 0x9184e72a00000000,
        0xb5e620f480000000, 0xe35fa931a0000000, 0x8e1bc9bf04000000,
        0xb1a2bc2ec5000000, 0xde0b6b3a76400000, 0x8ac7230489e80000,
        0xad78ebc5ac620000, 0xd8d726b7177a8000, 0x878678326eac9000,
        0xa968163f0a57b400, 0xd3c21bcecceda100, 0x84595161401484a0,
        0xa56fa5b99019a5c8, 0xcecb8f27f4200f3a, 0x813f3978f8940985,
        0xa18f07d736b90be6, 0xc9f2c9cd04674edf, 0xfc6f7c4045812297,
        0x9dc5ada82b70b59e, 0xc5371912364ce306, 0xf684df56c3e01bc7,
        0x9a130b963a6c115d, 0xc097ce7bc90715b4, 0xf0bdc21abb48db21,
        0x96769950b50d88f5, 0xbc143fa4e250eb32, 0xeb194f8e1ae525fe,
        0x92efd1b8d0cf37bf, 0xb7abc627050305ae, 0xe596b7b0c643c71a,
        0x8f7e32ce7bea5c70, 0xb35dbf821ae4f38c, 0xe0352f62a19e306f};
    return pow10_significands[k - float_info<float>::min_k];
  }